

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::initFromDoubleAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  ulong uVar2;
  fltSemantics *pfVar3;
  ulong uVar4;
  uint uVar5;
  Significand *pSVar6;
  uint uVar7;
  Significand *pSVar8;
  byte bVar9;
  
  if (api->BitWidth != 0x40) {
    __assert_fail("api.getBitWidth()==64",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc41,"void llvm::detail::IEEEFloat::initFromDoubleAPInt(const APInt &)");
  }
  uVar2 = (api->U).VAL;
  initialize(this,(fltSemantics *)semIEEEdouble);
  pfVar3 = this->semantics;
  if (0x3f < pfVar3->precision) {
    __assert_fail("partCount()==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc47,"void llvm::detail::IEEEFloat::initFromDoubleAPInt(const APInt &)");
  }
  uVar5 = (uint)(uVar2 >> 0x34) & 0x7ff;
  uVar4 = uVar2 & 0xfffffffffffff;
  bVar1 = this->field_0x12;
  bVar9 = (byte)(uVar2 >> 0x3c) & 8;
  if (uVar5 == 0 && uVar4 == 0) {
    bVar9 = bVar1 & 0xf0 | bVar9 | 3;
  }
  else {
    if (uVar5 != 0x7ff || uVar4 != 0) {
      bVar9 = bVar1 & 0xf0 | bVar9;
      if (uVar4 != 0 && uVar5 == 0x7ff) {
        this->field_0x12 = bVar9 | 1;
        if (pfVar3->precision - 0x40 < 0xffffff80) {
          pSVar6 = (Significand *)(this->significand).parts;
        }
        else {
          pSVar6 = &this->significand;
        }
        pSVar6->part = uVar4;
        return;
      }
      this->field_0x12 = bVar9 | 2;
      this->exponent = (short)uVar5 + -0x3ff;
      uVar7 = pfVar3->precision - 0x40;
      pSVar6 = &this->significand;
      pSVar8 = pSVar6;
      if (uVar7 < 0xffffff80) {
        pSVar8 = (Significand *)(this->significand).parts;
      }
      pSVar8->part = uVar4;
      if (uVar5 != 0) {
        if (uVar7 < 0xffffff80) {
          pSVar6 = (Significand *)pSVar6->parts;
        }
        pSVar6->part = pSVar6->part | 0x10000000000000;
        return;
      }
      this->exponent = -0x3fe;
      return;
    }
    bVar9 = bVar1 & 0xf0 | bVar9;
  }
  this->field_0x12 = bVar9;
  return;
}

Assistant:

void IEEEFloat::initFromDoubleAPInt(const APInt &api) {
  assert(api.getBitWidth()==64);
  uint64_t i = *api.getRawData();
  uint64_t myexponent = (i >> 52) & 0x7ff;
  uint64_t mysignificand = i & 0xfffffffffffffLL;

  initialize(&semIEEEdouble);
  assert(partCount()==1);

  sign = static_cast<unsigned int>(i>>63);
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x7ff && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x7ff && mysignificand!=0) {
    // exponent meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 1023;
    *significandParts() = mysignificand;
    if (myexponent==0)          // denormal
      exponent = -1022;
    else
      *significandParts() |= 0x10000000000000LL;  // integer bit
  }
}